

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall HPresolve::removeFreeColumnSingleton(HPresolve *this,int col,int row,int k)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ostream *poVar5;
  reference pvVar6;
  reference pvVar7;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  HPresolve *this_00;
  HTimerPre *this_01;
  int kk;
  int j;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> newCosts;
  value_type *in_stack_fffffffffffffec8;
  size_type __n;
  HTimerPre *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  int iVar8;
  HPresolve *in_stack_fffffffffffffee0;
  int local_38;
  
  HTimerPre::recordStart(in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  if (0 < *(int *)(in_RDI + 0x7c8)) {
    poVar5 = std::operator<<((ostream *)&std::cout,"PR: Free column singleton ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_ESI);
    poVar5 = std::operator<<(poVar5," removed. Row ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_EDX);
    poVar5 = std::operator<<(poVar5," removed.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x19fd61);
  pvVar6 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0,
                      (size_type)in_stack_fffffffffffffec8);
  local_38 = *pvVar6;
  while( true ) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0,
                        (size_type)in_stack_fffffffffffffec8);
    iVar8 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    if (*pvVar6 <= local_38) break;
    pvVar6 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0,
                        (size_type)in_stack_fffffffffffffec8);
    iVar8 = *pvVar6;
    pvVar6 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0,
                        (size_type)in_stack_fffffffffffffec8);
    if ((*pvVar6 != 0) && (iVar8 != in_ESI)) {
      std::vector<double,_std::allocator<double>_>::at
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
                 (size_type)in_stack_fffffffffffffec8);
      std::make_pair<int&,double&>
                ((int *)in_stack_fffffffffffffed0,(double *)in_stack_fffffffffffffec8);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::push_back
                ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
                          (size_type)in_stack_fffffffffffffec8);
      dVar1 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
                          (size_type)in_stack_fffffffffffffec8);
      dVar2 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
                          (size_type)in_stack_fffffffffffffec8);
      dVar3 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
                          (size_type)in_stack_fffffffffffffec8);
      dVar4 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
                          (size_type)in_stack_fffffffffffffec8);
      *pvVar7 = dVar1 - (dVar2 * dVar3) / dVar4;
    }
    local_38 = local_38 + 1;
  }
  if (*(int *)(in_RDI + 0x7cc) == 1) {
    std::
    stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
    ::push((stack<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
            *)in_stack_fffffffffffffed0,(value_type *)in_stack_fffffffffffffec8);
  }
  pvVar6 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0,
                      (size_type)in_stack_fffffffffffffec8);
  *pvVar6 = 0;
  std::vector<double,_std::allocator<double>_>::at
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
             (size_type)in_stack_fffffffffffffec8);
  std::stack<double,_std::deque<double,_std::allocator<double>_>_>::push
            ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)
             in_stack_fffffffffffffed0,(value_type *)in_stack_fffffffffffffec8);
  fillStackRowBounds(in_stack_fffffffffffffee0,iVar8);
  pvVar7 = std::vector<double,_std::allocator<double>_>::at
                     ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
                      (size_type)in_stack_fffffffffffffec8);
  *pvVar7 = 0.0;
  pvVar7 = std::vector<double,_std::allocator<double>_>::at
                     ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
                      (size_type)in_stack_fffffffffffffec8);
  this_00 = (HPresolve *)((ulong)*pvVar7 ^ 0x8000000000000000);
  pvVar7 = std::vector<double,_std::allocator<double>_>::at
                     ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
                      (size_type)in_stack_fffffffffffffec8);
  this_01 = (HTimerPre *)((double)this_00 / *pvVar7);
  pvVar7 = std::vector<double,_std::allocator<double>_>::at
                     ((vector<double,_std::allocator<double>_> *)this_01,
                      (size_type)in_stack_fffffffffffffec8);
  *pvVar7 = (value_type)this_01;
  addChange(this_00,(int)((ulong)pvVar7 >> 0x20),(int)pvVar7,(int)((ulong)this_01 >> 0x20));
  removeRow(this_00,(int)((ulong)pvVar7 >> 0x20));
  __n = 7;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xad0),7);
  *pvVar6 = *pvVar6 + 1;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xab8),__n);
  *pvVar6 = *pvVar6 + 1;
  HTimerPre::recordFinish(this_01,(int)(__n >> 0x20));
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)this_00);
  return;
}

Assistant:

void HPresolve::removeFreeColumnSingleton(const int col, const int row, const int k) {
	timer.recordStart(FREE_SING_COL);
	if (iPrint > 0)
		cout << "PR: Free column singleton " << col << " removed. Row " << row
				<< " removed." << endl;

	//modify costs
	vector<pair<int, double> > newCosts;
	int j;
	for (int kk = ARstart.at(row); kk < ARstart.at(row + 1); ++kk) {
		j = ARindex.at(kk);
		if (flagCol.at(j) && j != col) {
			newCosts.push_back(make_pair(j, colCost.at(j)));
			colCost.at(j) = colCost.at(j)
					- colCost.at(col) * ARvalue.at(kk) / Avalue.at(k);
		}
	}
	if (iKKTcheck == 1)
		chk.costs.push(newCosts);

	flagCol.at(col) = 0;
	postValue.push(colCost.at(col));
	fillStackRowBounds (row);

	valueColDual.at(col) = 0;
	valueRowDual.at(row) = -colCost.at(col) / Avalue.at(k);

	addChange(FREE_SING_COL, row, col);
	removeRow(row);

	countRemovedCols[FREE_SING_COL]++;
	countRemovedRows[FREE_SING_COL]++;
	timer.recordFinish(FREE_SING_COL);
}